

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O1

int prefix_f2(pt_ild *ild,uint8_t length,uint8_t rex)

{
  int iVar1;
  byte bVar2;
  
  if (ild == (pt_ild *)0x0) {
    iVar1 = -1;
  }
  else {
    *(ushort *)&ild->field_0x10 = (ushort)*(undefined4 *)&ild->field_0x10 & 0xff8f | 0x50;
    bVar2 = length + 1;
    iVar1 = -0xe;
    if (bVar2 < ild->max_bytes) {
      iVar1 = (*prefix_table[ild->itext[bVar2]])(ild,bVar2,'\0');
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int prefix_f2(struct pt_ild *ild, uint8_t length, uint8_t rex)
{
	(void) rex;

	if (!ild)
		return -pte_internal;

	ild->f2 = 1;
	ild->last_f2f3 = 2;

	return prefix_next(ild, length, 0);
}